

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O2

void __thiscall
rengine::GlyphTextureJob::renderSingleGlyph
          (GlyphTextureJob *this,int x,int y,uint *t,int tw,int th,uchar *b,int bw,int bh,int cr,
          int cg,int cb,int ca)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint *puVar11;
  
  uVar7 = 0;
  if (0 < bw) {
    uVar7 = (ulong)(uint)bw;
  }
  uVar10 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar10 = 0;
  }
  uVar6 = 0;
  puVar11 = t + (long)tw * (long)y + (long)x;
  do {
    if (uVar6 == uVar10) {
      return;
    }
    lVar3 = uVar6 + (long)y;
    if (lVar3 < 0) {
      __assert_fail("dy >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                    ,0xe0,
                    "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                   );
    }
    if (th <= lVar3) {
      __assert_fail("dy < th",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                    ,0xe1,
                    "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                   );
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      iVar1 = x + (int)uVar8;
      if (iVar1 < 0) {
        __assert_fail("x + xx >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xea,
                      "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                     );
      }
      if (tw <= iVar1) {
        __assert_fail("x + xx < tw",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xeb,
                      "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                     );
      }
      if (b[uVar8] != 0) {
        iVar4 = (uint)b[uVar8] * ca;
        iVar2 = iVar4 / 0xff;
        uVar5 = cr;
        iVar1 = cg;
        iVar9 = cb;
        if (0xfe < iVar4 - 0xfe01U) {
          uVar5 = iVar2 * cr >> 8;
          iVar1 = iVar2 * cg >> 8;
          iVar9 = iVar2 * cb >> 8;
        }
        puVar11[uVar8] = iVar1 << 8 | uVar5 | iVar9 << 0x10 | iVar2 << 0x18;
      }
    }
    uVar6 = uVar6 + 1;
    puVar11 = puVar11 + tw;
    b = b + bw;
  } while( true );
}

Assistant:

inline void GlyphTextureJob::renderSingleGlyph(int x, int y,
                                        unsigned int *t, int tw, int th,
                                        unsigned char *b, int bw, int bh,
                                        int cr, int cg, int cb, int ca)
{
    for (int yy=0; yy<bh; ++yy) {
        int dy = yy + y;

        assert(dy >= 0);
        assert(dy < th);
        // if (yy + y < 0)
        //     continue;
        // else if (yy + y > ctx->buffer->height)
        //     break;
        unsigned char *src = b + yy * bw;
        unsigned int *dst = t + dy * tw + x;

        for (int xx=0; xx<bw; ++xx) {
            assert(x + xx >= 0);
            assert(x + xx < tw);
            unsigned char s = src[xx];
            if (s == 0)
                continue;
            // if (xx + x < 0)
            //     continue;
            // else if (xx + x > ctx->buffer->width)
            //     break;
            int alpha = ca * s / 255;

            int r, g, b;
            if (alpha == 255) {
                r = cr;
                g = cg;
                b = cb;
            } else {
                r = (alpha * cr) >> 8;
                g = (alpha * cg) >> 8;
                b = (alpha * cb) >> 8;
            }

            dst[xx] = (alpha << 24)
                      | (b << 16)
                      | (g << 8)
                      | r;
        }
    }
    // color[3] = alpha;

}